

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.c
# Opt level: O2

void yelp(monst *mtmp)

{
  boolean bVar1;
  byte bVar2;
  uint uVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  uchar uVar3;
  
  if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
    return;
  }
  uVar3 = mtmp->data->msound;
  if (uVar3 == '\0') {
    return;
  }
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if ((u.umonnum == u.umonster) || (bVar1 = dmgtype(youmonst.data,0x24), bVar1 == '\0')) {
      uVar4 = mt_random();
      ppcVar5 = h_sounds + (ulong)uVar4 % 0x24;
      goto LAB_002357cc;
    }
    uVar3 = mtmp->data->msound;
  }
  bVar2 = uVar3 - 1;
  if ((10 < bVar2) || ((0x43fU >> (bVar2 & 0x1f) & 1) == 0)) {
    return;
  }
  ppcVar5 = &PTR_anon_var_dwarf_1099d7_0030cf88 + bVar2;
LAB_002357cc:
  pcVar7 = *ppcVar5;
  pcVar6 = Monnam(mtmp);
  pcVar7 = vtense((char *)0x0,pcVar7);
  pline("%s %s!",pcVar6,pcVar7);
  if (flags.run != 0) {
    nomul(0,(char *)0x0);
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,mtmp->data->mlevel * 0xc);
  return;
}

Assistant:

void yelp(struct monst *mtmp)
{
    const char *yelp_verb = 0;

    if (mtmp->msleeping || !mtmp->mcanmove || !mtmp->data->msound)
	return;

    /* presumably nearness and soundok checks have already been made */
    if (Hallucination)
	yelp_verb = h_sounds[rn2(SIZE(h_sounds))];
    else switch (mtmp->data->msound) {
	case MS_MEW:
	    yelp_verb = "yowl";
	    break;
	case MS_BARK:
	case MS_GROWL:
	    yelp_verb = "yelp";
	    break;
	case MS_ROAR:
	    yelp_verb = "snarl";
	    break;
	case MS_SQEEK:
	    yelp_verb = "squeal";
	    break;
	case MS_SQAWK:
	    yelp_verb = "screak";
	    break;
	case MS_WAIL:
	    yelp_verb = "wail";
	    break;
    }
    if (yelp_verb) {
	pline("%s %s!", Monnam(mtmp), vtense(NULL, yelp_verb));
	if (flags.run) nomul(0, NULL);
	wake_nearto(mtmp->mx, mtmp->my, mtmp->data->mlevel * 12);
    }
}